

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O3

int __thiscall MemoryMappedFile::open(MemoryMappedFile *this,char *__file,int __oflag,...)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  undefined8 uVar5;
  int in_ECX;
  int __fd;
  Log errStream;
  stat st;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  Log local_198;
  Log local_188;
  Log local_178;
  Log local_168;
  Log local_158;
  Log local_148;
  Log local_138;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  size_t local_f8;
  Log local_98;
  Log local_88;
  Log local_78;
  Log local_68;
  Log local_58;
  Log local_48;
  Log local_38;
  
  iVar2 = (int)&local_1a8;
  if (this->mAccessType != NO_ACCESS) {
    close(this,(int)__file);
  }
  if (__oflag == 0) {
    local_1a8.mValue = 1;
    Log::Log((Log *)&local_128,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_1a8);
    Log::write(&local_38,(int)&local_128,"Can\'t create MemoryMappedFile with access type NO_ACCESS"
               ,0xffffffff);
    if (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    iVar1 = ::open(*(char **)__file,(uint)(__oflag != 1) * 2);
    this->mFd = iVar1;
    __fd = (int)&local_1a8;
    if (iVar1 == -1) {
      local_128.mValue = 1;
      Log::Log(&local_198,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_128);
      Log::write(&local_138,(int)&local_198,"Could not open file ",0xffffffff);
      Log::write((Log *)&local_128,(int)&local_138,*(void **)__file,(ulong)*(uint *)(__file + 8));
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
      Log::Log((Log *)&local_1a8,&local_138);
      if (local_138.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      piVar3 = __errno_location();
      if (*piVar3 == 2) {
        Log::write(&local_48,__fd," (file does not exist)",0xffffffff);
      }
      else {
        Log::write((Log *)&local_128,__fd,". errno=",0xffffffff);
        Log::addStringStream<int>(&local_58,(int)&local_128);
        local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_120;
        if (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = local_120;
        }
      }
      local_120 = local_1a0;
      if (local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        local_120 = local_1a0;
      }
    }
    else {
      if (in_ECX != 0) {
LAB_0016bf50:
        iVar2 = fstat(iVar1,(stat *)&local_128);
        if (iVar2 != 0) {
          local_1a8.mValue = 1;
          Log::Log(&local_178,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_1a8);
          Log::write(&local_158,(int)&local_178,"Could not stat file ",0xffffffff);
          Log::write((Log *)&local_1a8,(int)&local_158,*(void **)__file,(ulong)*(uint *)(__file + 8)
                    );
          if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
          }
          Log::Log(&local_188,&local_158);
          Log::write(&local_198,(int)&local_188,". errno=",0xffffffff);
          __errno_location();
          iVar2 = (int)&local_198;
          Log::addStringStream<int>(&local_88,iVar2);
          if (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_188.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_188.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_158.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_158.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_178.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_178.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          close(this,iVar2);
          return 0;
        }
        this->mFileSize = local_f8;
        if (local_f8 == 0) {
          uVar5 = std::__cxx11::string::_M_assign((string *)&this->mFilename);
          this->mAccessType = __oflag;
          this->mpMapped = (void *)0x0;
        }
        else {
          pvVar4 = mmap((void *)0x0,local_f8,(uint)(__oflag != 1) * 2 + 1,1,this->mFd,0);
          this->mpMapped = pvVar4;
          if (pvVar4 == (void *)0xffffffffffffffff) {
            this->mpMapped = (void *)0x0;
            close(this,(int)local_f8);
            local_1a8.mValue = 1;
            Log::Log(&local_178,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_1a8);
            Log::write(&local_168,(int)&local_178,"Could not map file ",0xffffffff);
            Log::write((Log *)&local_1a8,(int)&local_168,*(void **)__file,
                       (ulong)*(uint *)(__file + 8));
            if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
            }
            Log::Log(&local_188,&local_168);
            Log::write(&local_198,(int)&local_188,". errno=",0xffffffff);
            __errno_location();
            Log::addStringStream<int>(&local_98,(int)&local_198);
            if (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_188.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_188.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_120 = local_178.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
            if (local_168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_168.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              local_120 = local_178.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            }
            goto LAB_0016c37c;
          }
          uVar5 = std::__cxx11::string::_M_assign((string *)&this->mFilename);
          this->mAccessType = __oflag;
        }
        return (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      do {
        iVar1 = flock(this->mFd,6);
        if (iVar1 != -1) {
          iVar1 = this->mFd;
          goto LAB_0016bf50;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      local_128.mValue = 1;
      Log::Log(&local_198,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_128);
      Log::write(&local_148,(int)&local_198,"Could not lock file ",0xffffffff);
      Log::write((Log *)&local_128,(int)&local_148,*(void **)__file,(ulong)*(uint *)(__file + 8));
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
      Log::Log((Log *)&local_1a8,&local_148);
      if (local_148.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (*piVar3 == 0xb) {
        Log::write(&local_68,__fd," (file is already locked)",0xffffffff);
      }
      else {
        Log::write((Log *)&local_128,__fd,". errno=",0xffffffff);
        iVar2 = (int)&local_128;
        Log::addStringStream<int>(&local_78,iVar2);
        local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_120;
        if (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = local_120;
        }
      }
      if (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      close(this,iVar2);
      local_120 = local_1a0;
    }
  }
LAB_0016c37c:
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  return 0;
}

Assistant:

bool MemoryMappedFile::open(const Path &f_filename, AccessType f_access,
                            LockType f_lock)
{
    if(isOpen()) close();

    if(f_access == NO_ACCESS)
    {
        error() << "Can't create MemoryMappedFile with access type NO_ACCESS";
        return false;
    }

#ifdef _WIN32

    const DWORD access = (f_access == READ_ONLY) ?
        GENERIC_READ : (GENERIC_READ | GENERIC_WRITE);
    const DWORD share = (f_lock == DO_LOCK) ?
        0 : (FILE_SHARE_READ | FILE_SHARE_WRITE);
    const DWORD protect = (f_access == READ_ONLY) ?
        PAGE_READONLY : PAGE_READWRITE;
    const DWORD desiredAccess = (f_access == READ_ONLY) ?
        FILE_MAP_READ : FILE_MAP_WRITE; // FILE_MAP_WRITE includes read access

    // first, we need to open the file:
    mhFile = CreateFileW(Utf8To16(f_filename.nullTerminated()),
                         access,
                         share,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);

    if(mhFile == INVALID_HANDLE_VALUE)
    {
        const DWORD errorCode = GetLastError();

        auto errStream = error() << "Can't open file " << f_filename;
        switch(errorCode)
        {
        case ERROR_FILE_NOT_FOUND:
            errStream << " (file not found)";
            break;
        case ERROR_SHARING_VIOLATION:
            errStream << " (file is locked)";
            break;
        default:
            errStream << "GetLastError(): " << errorCode;
        }

        return false;
    }

    mFileSize = GetFileSize(mhFile, NULL);

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can set up a file mapping:
    mhFileMapping = CreateFileMapping(mhFile,   // file to map
                                      NULL,     // security attrs
                                      protect,
                                      0, 0,     // use full file size
                                      NULL);    // name

    if(mhFileMapping == NULL)
    {
        error() << "Can't map file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

    // now we need to open a so-called "view" into the file mapping:
    mpMapped = MapViewOfFile(mhFileMapping, desiredAccess,
                             0,0,  // offset high and low
                             0);   // size


    if(mpMapped == NULL)
    {
        error() << "Can't map view of file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

#else
    // try to open the file
    const int openFlags = (f_access == READ_ONLY) ?
        O_RDONLY : O_RDWR;
    const int protFlags = (f_access == READ_ONLY) ?
        PROT_READ : (PROT_READ | PROT_WRITE);

    mFd = ::open(f_filename.nullTerminated(), openFlags);

    if(mFd == -1)
    {
        auto errStream = error() << "Could not open file " << f_filename;
        switch(errno)
        {
        case ENOENT:
            errStream << " (file does not exist)";
            break;
        default:
            errStream << ". errno=" << errno;
            break;
        }
        return false;
    }

    if(f_lock == DO_LOCK)
    {
        int lockRes;
        eintrwrap(lockRes, flock(mFd, LOCK_EX | LOCK_NB));

        if(lockRes == -1)
        {
            auto errStream = error() << "Could not lock file " << f_filename;
            switch(errno)
            {
            case EWOULDBLOCK:
                errStream << " (file is already locked)";
                break;
            default:
                errStream << ". errno=" << errno;
                break;
            }
            close();
            return false;
        }
    }

    // get file size
    struct stat st;
    if(fstat(mFd, &st) != 0)
    {
        error() << "Could not stat file " << f_filename
                << ". errno=" << errno;
        close();
        return false;
    }

    mFileSize = st.st_size;   // size in byte

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can actually map the file
    mpMapped = mmap(
            NULL,       // destination hint
            mFileSize,
            protFlags,  // mmu page protection
            MAP_SHARED,
            mFd,
            0           // offset
        );

    if(mpMapped == MAP_FAILED)
    {
        mpMapped = nullptr;
        close();
        error() << "Could not map file " << f_filename
                << ". errno=" << errno;
        return false;
    }

#endif

    // everything worked out! We're done.
    mFilename = f_filename;
    mAccessType = f_access;
    return true;
}